

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

unsigned_long util::long_rand(void)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = ::rand();
  uVar2 = ::rand();
  return (ulong)(uVar2 & 0xffff | iVar1 << 0x10);
}

Assistant:

static unsigned long long_rand()
{
	typedef unsigned long ul;
#if RAND_MAX < 65535
	return ul(std::rand() & 0xFF) << 24 | ul(std::rand() & 0xFF) << 16 | ul(std::rand() & 0xFF) << 8 | ul(std::rand() & 0xFF);
#else
#if RAND_MAX < 4294967295
	return ul(std::rand() & 0xFFFF) << 16 | ul(std::rand() & 0xFFFF);
#else
	return ul(std::rand() & 0xFFFFFFFFU);
#endif
#endif
}